

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alconfig.cpp
# Opt level: O1

string * __thiscall
(anonymous_namespace)::expdup_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *str)

{
  _anonymous_namespace_ *__s;
  _anonymous_namespace_ _Var1;
  _anonymous_namespace_ _Var2;
  int iVar3;
  char *pcVar4;
  undefined8 *puVar5;
  long *plVar6;
  size_t unaff_RBX;
  _anonymous_namespace_ *unaff_R12;
  size_t sVar7;
  _anonymous_namespace_ *p_Var8;
  string envname;
  string envval;
  long *local_d8;
  undefined8 local_d0;
  long local_c8;
  undefined8 uStack_c0;
  long *local_b8 [2];
  long local_a8 [2];
  _anonymous_namespace_ *local_98;
  size_t local_90;
  _anonymous_namespace_ local_88;
  undefined7 uStack_87;
  al local_78 [8];
  long *local_70;
  undefined8 local_68;
  long local_60;
  undefined8 uStack_58;
  long *local_50;
  undefined8 local_48;
  undefined1 local_40;
  uint7 uStack_3f;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_98 = &local_88;
  local_90 = 0;
  local_88 = (_anonymous_namespace_)0x0;
  while (*this == (_anonymous_namespace_)0x24) {
    __s = this + 1;
    _Var1 = this[1];
    if (_Var1 == (_anonymous_namespace_)0x24) {
      pcVar4 = strchr((char *)(this + 2),0x24);
      if (pcVar4 == (char *)0x0) {
        sVar7 = strlen((char *)__s);
      }
      else {
        sVar7 = (long)pcVar4 - (long)__s;
      }
      p_Var8 = __s + sVar7;
      unaff_R12 = __s;
      goto LAB_0013d4ff;
    }
    p_Var8 = this + 2;
    if (_Var1 != (_anonymous_namespace_)0x7b) {
      p_Var8 = __s;
    }
    this = p_Var8 + -1;
    do {
      do {
        _Var2 = this[1];
        this = this + 1;
        iVar3 = isalnum((int)(char)_Var2);
      } while ((char)_Var2 == 0x5f);
    } while (iVar3 != 0);
    if (_Var2 == (_anonymous_namespace_)0x7d || _Var1 != (_anonymous_namespace_)0x7b) {
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,p_Var8,this);
      al::getenv_abi_cxx11_(local_78,(char *)local_b8[0]);
      local_48 = 0;
      local_40 = 0;
      local_d8 = &local_c8;
      if (local_78[0] == (al)0x1) {
        if (local_70 == &local_60) {
          uStack_c0 = uStack_58;
        }
        else {
          local_d8 = local_70;
        }
        local_c8 = local_60;
        local_d0 = local_68;
        puVar5 = &local_68;
        plVar6 = &local_60;
        local_70 = &local_60;
      }
      else {
        local_c8 = (ulong)uStack_3f << 8;
        uStack_c0 = uStack_38;
        local_d0 = 0;
        puVar5 = &local_48;
        plVar6 = (long *)&local_40;
      }
      local_50 = (long *)&local_40;
      *puVar5 = 0;
      *(undefined1 *)plVar6 = 0;
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_d8);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_50 != (long *)&local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      if ((local_78[0] == (al)0x1) && (local_70 != &local_60)) {
        operator_delete(local_70,local_60 + 1);
      }
      unaff_RBX = local_90;
      unaff_R12 = local_98;
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0],local_a8[0] + 1);
      }
      this = this + (_Var1 == (_anonymous_namespace_)0x7b);
    }
    p_Var8 = this;
    sVar7 = unaff_RBX;
    if (_Var2 == (_anonymous_namespace_)0x7d || _Var1 != (_anonymous_namespace_)0x7b) {
LAB_0013d4ff:
      this = p_Var8;
      unaff_RBX = 0;
      if (sVar7 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)unaff_R12);
        unaff_RBX = sVar7;
      }
    }
  }
  if (*this == (_anonymous_namespace_)0x0) {
    if (local_98 != &local_88) {
      operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
    }
    return __return_storage_ptr__;
  }
  pcVar4 = strchr((char *)this,0x24);
  if (pcVar4 == (char *)0x0) {
    sVar7 = strlen((char *)this);
  }
  else {
    sVar7 = (long)pcVar4 - (long)this;
  }
  p_Var8 = this + sVar7;
  unaff_R12 = this;
  goto LAB_0013d4ff;
}

Assistant:

std::string expdup(const char *str)
{
    std::string output;

    std::string envval;
    while(*str != '\0')
    {
        const char *addstr;
        size_t addstrlen;

        if(str[0] != '$')
        {
            const char *next = std::strchr(str, '$');
            addstr = str;
            addstrlen = next ? static_cast<size_t>(next-str) : std::strlen(str);

            str += addstrlen;
        }
        else
        {
            str++;
            if(*str == '$')
            {
                const char *next = std::strchr(str+1, '$');
                addstr = str;
                addstrlen = next ? static_cast<size_t>(next-str) : std::strlen(str);

                str += addstrlen;
            }
            else
            {
                const bool hasbraces{(*str == '{')};

                if(hasbraces) str++;
                const char *envstart = str;
                while(std::isalnum(*str) || *str == '_')
                    ++str;
                if(hasbraces && *str != '}')
                    continue;
                const std::string envname{envstart, str};
                if(hasbraces) str++;

                envval = al::getenv(envname.c_str()).value_or(std::string{});
                addstr = envval.data();
                addstrlen = envval.length();
            }
        }
        if(addstrlen == 0)
            continue;

        output.append(addstr, addstrlen);
    }

    return output;
}